

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileCommand.cxx
# Opt level: O2

void __thiscall
anon_unknown.dwarf_41b8ba::cURLProgressHelper::cURLProgressHelper
          (cURLProgressHelper *this,cmFileCommand *fc,char *text)

{
  (this->Text)._M_dataplus._M_p = (pointer)&(this->Text).field_2;
  (this->Text)._M_string_length = 0;
  (this->Text).field_2._M_local_buf[0] = '\0';
  this->CurrentPercentage = -1;
  this->FileCommand = fc;
  std::__cxx11::string::assign((char *)&this->Text);
  return;
}

Assistant:

cURLProgressHelper(cmFileCommand* fc, const char* text)
  {
    this->CurrentPercentage = -1;
    this->FileCommand = fc;
    this->Text = text;
  }